

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::FileExists(char *filename)

{
  allocator local_39;
  string local_38;
  char *local_18;
  char *filename_local;
  
  if (filename == (char *)0x0) {
    filename_local._7_1_ = 0;
  }
  else {
    local_18 = filename;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,filename,&local_39);
    filename_local._7_1_ = FileExists(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return (bool)(filename_local._7_1_ & 1);
}

Assistant:

bool SystemTools::FileExists(const char* filename)
{
  if(!filename)
    {
    return false;
    }
  return SystemTools::FileExists(std::string(filename));
}